

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqlite_compile(unqlite *pDb,char *zJx9,int nByte,unqlite_vm **ppOut)

{
  jx9 *pEngine;
  sxi32 sVar1;
  int iVar2;
  char *in_R8;
  char *zSrc;
  jx9_vm *pVm;
  SyString local_30;
  
  sVar1 = -0x18;
  if ((((pDb != (unqlite *)0x0) && (ppOut != (unqlite_vm **)0x0)) && (pDb->nMagic == 0xdb7c2712)) &&
     ((pEngine = (pDb->sDB).pJx9, pEngine != (jx9 *)0x0 && (pEngine->nMagic == 0xf874bcd7)))) {
    local_30.nByte = nByte;
    if (zJx9 == (char *)0x0) {
      local_30.nByte = 1;
    }
    zSrc = ";";
    if (zJx9 != (char *)0x0) {
      zSrc = zJx9;
    }
    if ((int)local_30.nByte < 0) {
      local_30.nByte = SyStrlen(zSrc);
    }
    local_30.zString = zSrc;
    sVar1 = ProcessScript(pEngine,&pVm,&local_30,0,in_R8);
    if (sVar1 == 0) {
      iVar2 = unqliteInitVm(pDb,pVm,ppOut);
      sVar1 = 0;
      if (iVar2 != 0) {
        jx9_vm_release(pVm);
        sVar1 = -1;
      }
    }
  }
  return sVar1;
}

Assistant:

int unqlite_compile(unqlite *pDb,const char *zJx9,int nByte,unqlite_vm **ppOut)
{
	jx9_vm *pVm;
	int rc;
	if( UNQLITE_DB_MISUSE(pDb) || ppOut == 0){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT;
	 }
#endif
	 /* Compile the Jx9 script first */
	 rc = jx9_compile(pDb->sDB.pJx9,zJx9,nByte,&pVm);
	 if( rc == JX9_OK ){
		 /* Allocate a new unqlite VM instance */
		 rc = unqliteInitVm(pDb,pVm,ppOut);
		 if( rc != UNQLITE_OK ){
			 /* Release the Jx9 VM */
			 jx9_vm_release(pVm);
		 }
	 }
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}